

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

void av1_free_cdef_buffers(AV1_COMMON *cm,AV1CdefWorkerData **cdef_worker,AV1CdefSync *cdef_sync)

{
  long *in_RSI;
  long in_RDI;
  int idx;
  int plane;
  int num_mi_rows;
  CdefInfo *cdef_info;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar1;
  int local_28;
  
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    aom_free((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    *(undefined8 *)(in_RDI + 0x5bd8 + (long)local_28 * 8) = 0;
  }
  free_cdef_bufs((uint16_t **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (uint16_t **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  free_cdef_row_sync((AV1CdefRowSync **)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
  if ((1 < *(int *)(in_RDI + 0x5cc0)) && (*in_RSI != 0)) {
    iVar1 = *(int *)(in_RDI + 0x5cc0);
    while (iVar1 = iVar1 + -1, 0 < iVar1) {
      free_cdef_bufs((uint16_t **)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                     (uint16_t **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    aom_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    *in_RSI = 0;
  }
  return;
}

Assistant:

void av1_free_cdef_buffers(AV1_COMMON *const cm,
                           AV1CdefWorkerData **cdef_worker,
                           AV1CdefSync *cdef_sync) {
  CdefInfo *cdef_info = &cm->cdef_info;
  const int num_mi_rows = cdef_info->allocated_mi_rows;

  for (int plane = 0; plane < MAX_MB_PLANE; plane++) {
    aom_free(cdef_info->linebuf[plane]);
    cdef_info->linebuf[plane] = NULL;
  }
  // De-allocation of column buffer & source buffer (worker_0).
  free_cdef_bufs(cdef_info->colbuf, &cdef_info->srcbuf);

  free_cdef_row_sync(&cdef_sync->cdef_row_mt, num_mi_rows);

  if (cdef_info->allocated_num_workers < 2) return;
  if (*cdef_worker != NULL) {
    for (int idx = cdef_info->allocated_num_workers - 1; idx >= 1; idx--) {
      // De-allocation of column buffer & source buffer for remaining workers.
      free_cdef_bufs((*cdef_worker)[idx].colbuf, &(*cdef_worker)[idx].srcbuf);
    }
    aom_free(*cdef_worker);
    *cdef_worker = NULL;
  }
}